

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

MVNParameter * __thiscall caffe::MVNParameter::New(MVNParameter *this,Arena *arena)

{
  MVNParameter *this_00;
  
  this_00 = (MVNParameter *)operator_new(0x20);
  MVNParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::MVNParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

MVNParameter* MVNParameter::New(::google::protobuf::Arena* arena) const {
  MVNParameter* n = new MVNParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}